

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execSccEa<(moira::Instr)113,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  u32 val;
  
  addr = computeEA<(moira::Mode)6,(moira::Size)1,0ul>(this,opcode & 7);
  readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  val = 0xff;
  if ((this->reg).sr.v != false) {
    val = 0;
  }
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,val);
  return;
}

Assistant:

void
Moira::execSccEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,Byte>(dst, ea, data)) return;

    data = cond<I>() ? 0xFF : 0;
    prefetch();

    writeOp <M,Byte, POLLIPL> (dst, ea, data);
}